

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::IsConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  Op OVar1;
  IRContext *this_00;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  Instruction *this_01;
  uint uVar5;
  
  while( true ) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,type_id);
    OVar1 = this_01->opcode_;
    if (OpTypeStruct < OVar1) goto LAB_004f2eff;
    if ((0x11800000U >> (OVar1 & OpTypeOpaque) & 1) == 0) break;
    uVar4 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar4 = (uint)this_01->has_result_id_;
    }
    type_id = Instruction::GetSingleWordOperand(this_01,uVar4);
  }
  if ((0x600000U >> (OVar1 & OpTypeOpaque) & 1) == 0) {
    if (OVar1 == OpTypeStruct) {
      uVar2 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar2 = (uint)this_01->has_result_id_;
      }
      bVar3 = true;
      if (uVar2 != (int)((ulong)((long)(this_01->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_01->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
         ) {
        uVar5 = 0;
        do {
          uVar4 = Instruction::GetSingleWordOperand(this_01,uVar2 + uVar5);
          bVar3 = IsConcreteType(this,uVar4);
          if (!bVar3) {
            return bVar3;
          }
          uVar5 = uVar5 + 1;
          uVar2 = (this_01->has_result_id_ & 1) + 1;
          if (this_01->has_type_id_ == false) {
            uVar2 = (uint)this_01->has_result_id_;
          }
        } while (uVar5 < (int)((ulong)((long)(this_01->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_01->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar2);
      }
    }
    else {
LAB_004f2eff:
      bVar3 = false;
    }
  }
  else {
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ReplaceDescArrayAccessUsingVarIndex::IsConcreteType(
    uint32_t type_id) const {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
  if (type_inst->opcode() == spv::Op::OpTypeInt ||
      type_inst->opcode() == spv::Op::OpTypeFloat) {
    return true;
  }
  if (type_inst->opcode() == spv::Op::OpTypeVector ||
      type_inst->opcode() == spv::Op::OpTypeMatrix ||
      type_inst->opcode() == spv::Op::OpTypeArray) {
    return IsConcreteType(type_inst->GetSingleWordInOperand(0));
  }
  if (type_inst->opcode() == spv::Op::OpTypeStruct) {
    for (uint32_t i = 0; i < type_inst->NumInOperands(); ++i) {
      if (!IsConcreteType(type_inst->GetSingleWordInOperand(i))) return false;
    }
    return true;
  }
  return false;
}